

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O2

void __thiscall AutoArgParse::ParseException::~ParseException(ParseException *this)

{
  *(undefined ***)this = &PTR__ParseException_00110a20;
  std::__cxx11::string::~string((string *)&this->errorMessage);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~ParseException() = default;